

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

string * __thiscall Loader::fileToBinStr(string *__return_storage_ptr__,Loader *this,string *file)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  ostream *this_00;
  ifstream binFile;
  stringstream hexString;
  undefined1 local_1a0 [376];
  
  std::ifstream::ifstream(&binFile,(string *)file,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&hexString);
  std::istream::seekg((long)&binFile,_S_beg);
  uVar2 = std::istream::tellg();
  std::istream::seekg((long)&binFile,_S_beg);
  pvVar3 = operator_new__((ulong)uVar2);
  std::istream::read((char *)&binFile,(long)pvVar3);
  std::ifstream::close();
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)uVar2 < 0) break;
    this_00 = std::operator<<(local_1a0,0x30);
    lVar1 = *(long *)this_00;
    *(undefined8 *)(this_00 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(this_00 + lVar1 + 0x18) = *(uint *)(this_00 + lVar1 + 0x18) & 0xffffffb5 | 8;
    std::ostream::operator<<(this_00,(uint)*(byte *)((long)pvVar3 + (ulong)(uVar2 & 0x7fffffff)));
  }
  operator_delete(pvVar3,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&hexString);
  std::ifstream::~ifstream(&binFile);
  return __return_storage_ptr__;
}

Assistant:

string Loader::fileToBinStr(string file) {
	ifstream binFile(file);
	stringstream hexString;

	char *buffer;
	binFile.seekg(0, ios::end);
	unsigned int byteCount = binFile.tellg();
	binFile.seekg(0, ios::beg);
	buffer = new char[byteCount];
	binFile.read(buffer, byteCount);
	binFile.close();

	for (int i = byteCount - 1; i >= 0; i--) {
		hexString << setfill('0') << setw(2) << std::hex
				<< (int) ((unsigned char) buffer[i]);
	}

	delete buffer;

	return hexString.str();
}